

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

void __thiscall snappy::SnappySinkAllocator::Flush(SnappySinkAllocator *this,size_t size)

{
  ulong uVar1;
  pointer pDVar2;
  pointer pDVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  pDVar2 = (this->blocks_).
           super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->blocks_).
           super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar3 != pDVar2) {
    lVar6 = 8;
    uVar4 = 0;
    lVar7 = 0;
    do {
      uVar1 = *(ulong *)((long)&pDVar2->data + lVar6);
      uVar5 = size - lVar7;
      if (uVar1 <= size - lVar7) {
        uVar5 = uVar1;
      }
      (*this->dest_->_vptr_Sink[4])
                (this->dest_,*(undefined8 *)((long)pDVar2 + lVar6 + -8),uVar5,Deleter,0);
      lVar7 = lVar7 + uVar5;
      uVar4 = uVar4 + 1;
      pDVar2 = (this->blocks_).
               super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (this->blocks_).
               super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x10;
    } while (uVar4 < (ulong)((long)pDVar3 - (long)pDVar2 >> 4));
  }
  if (pDVar3 != pDVar2) {
    (this->blocks_).
    super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar2;
  }
  return;
}

Assistant:

void Flush(size_t size) {
    size_t size_written = 0;
    size_t block_size;
    for (int i = 0; i < blocks_.size(); ++i) {
      block_size = min<size_t>(blocks_[i].size, size - size_written);
      dest_->AppendAndTakeOwnership(blocks_[i].data, block_size,
                                    &SnappySinkAllocator::Deleter, NULL);
      size_written += block_size;
    }
    blocks_.clear();
  }